

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall
helics::FunctionExecutionFailure::~FunctionExecutionFailure(FunctionExecutionFailure *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit FunctionExecutionFailure(
        std::string_view message = "HELICS execution failure") noexcept: HelicsException(message)
    {
    }